

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curl_addrinfo.c
# Opt level: O0

Curl_addrinfo * Curl_ip2addr(int af,void *inaddr,char *hostname,int port)

{
  hostent *he;
  char *pcVar1;
  short local_60;
  size_t addrsize;
  char *hoststr;
  char *addrentry;
  namebuff *buf;
  hostent *h;
  Curl_addrinfo *ai;
  int port_local;
  char *hostname_local;
  void *inaddr_local;
  Curl_addrinfo *pCStack_10;
  int af_local;
  
  he = (hostent *)(*Curl_cmalloc)(0x40);
  if (he == (hostent *)0x0) {
    pCStack_10 = (Curl_addrinfo *)0x0;
  }
  else {
    pcVar1 = (*Curl_cstrdup)(hostname);
    if (pcVar1 == (char *)0x0) {
      (*Curl_cfree)(he);
      pCStack_10 = (Curl_addrinfo *)0x0;
    }
    else {
      if (af == 2) {
        local_60 = 4;
        *(undefined4 *)&he[1].h_name = *inaddr;
      }
      else {
        if (af != 10) {
          (*Curl_cfree)(pcVar1);
          (*Curl_cfree)(he);
          return (Curl_addrinfo *)0x0;
        }
        local_60 = 0x10;
        he[1].h_name = *inaddr;
        he[1].h_aliases = *(char ***)((long)inaddr + 8);
      }
      hoststr = (char *)(he + 1);
      he->h_name = pcVar1;
      he->h_aliases = (char **)0x0;
      he->h_addrtype = (int)(short)af;
      he->h_length = (int)local_60;
      he->h_addr_list = (char **)&he[1].h_addrtype;
      *he->h_addr_list = hoststr;
      he->h_addr_list[1] = (char *)0x0;
      pCStack_10 = Curl_he2ai(he,port);
      (*Curl_cfree)(pcVar1);
      (*Curl_cfree)(he);
    }
  }
  return pCStack_10;
}

Assistant:

struct Curl_addrinfo *
Curl_ip2addr(int af, const void *inaddr, const char *hostname, int port)
{
  struct Curl_addrinfo *ai;

#if defined(__VMS) && \
    defined(__INITIAL_POINTER_SIZE) && (__INITIAL_POINTER_SIZE == 64)
#pragma pointer_size save
#pragma pointer_size short
#pragma message disable PTRMISMATCH
#endif

  struct hostent  *h;
  struct namebuff *buf;
  char  *addrentry;
  char  *hoststr;
  size_t addrsize;

  DEBUGASSERT(inaddr && hostname);

  buf = malloc(sizeof(struct namebuff));
  if(!buf)
    return NULL;

  hoststr = strdup(hostname);
  if(!hoststr) {
    free(buf);
    return NULL;
  }

  switch(af) {
  case AF_INET:
    addrsize = sizeof(struct in_addr);
    addrentry = (void *)&buf->addrentry.ina4;
    memcpy(addrentry, inaddr, sizeof(struct in_addr));
    break;
#ifdef USE_IPV6
  case AF_INET6:
    addrsize = sizeof(struct in6_addr);
    addrentry = (void *)&buf->addrentry.ina6;
    memcpy(addrentry, inaddr, sizeof(struct in6_addr));
    break;
#endif
  default:
    free(hoststr);
    free(buf);
    return NULL;
  }

  h = &buf->hostentry;
  h->h_name = hoststr;
  h->h_aliases = NULL;
  h->h_addrtype = (short)af;
  h->h_length = (short)addrsize;
  h->h_addr_list = &buf->h_addr_list[0];
  h->h_addr_list[0] = addrentry;
  h->h_addr_list[1] = NULL; /* terminate list of entries */

#if defined(__VMS) && \
    defined(__INITIAL_POINTER_SIZE) && (__INITIAL_POINTER_SIZE == 64)
#pragma pointer_size restore
#pragma message enable PTRMISMATCH
#endif

  ai = Curl_he2ai(h, port);

  free(hoststr);
  free(buf);

  return ai;
}